

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  iterator def;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  Kind KVar4;
  int iVar5;
  IRContext *pIVar6;
  DefUseManager *this_00;
  pointer ppVar7;
  TypeManager *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *this_01;
  size_type sVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  undefined1 auVar12 [16];
  uint32_t local_e4;
  double local_e0;
  double percent_used;
  Constant *size_const;
  Type *pTStack_c8;
  uint32_t total_size;
  Type *load_type;
  TypeManager *type_mgr;
  ConstantManager *const_mgr;
  anon_class_8_1_eee54425 aStack_a8;
  bool should_replace;
  function<bool_(spvtools::opt::Instruction_*)> local_a0;
  undefined1 local_80 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_used;
  _Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> _Stack_48;
  bool all_elements_used;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> local_38;
  iterator cached_result;
  Instruction *op_inst;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  ReduceLoadSize *this_local;
  
  pIVar6 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_def_use_mgr(pIVar6);
  uVar2 = opt::Instruction::GetSingleWordInOperand(inst,0);
  cached_result.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>)
       analysis::DefUseManager::GetDef(this_00,uVar2);
  OVar3 = opt::Instruction::opcode
                    ((Instruction *)
                     cached_result.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur);
  if (OVar3 == OpLoad) {
    local_3c = opt::Instruction::result_id
                         ((Instruction *)
                          cached_result.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                          _M_cur);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
         ::find(&this->should_replace_cache_,&local_3c);
    _Stack_48._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
         ::end(&this->should_replace_cache_);
    bVar1 = std::__detail::operator!=(&local_38,&stack0xffffffffffffffb8);
    if (bVar1) {
      ppVar7 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false> *)
                          &local_38);
      this_local._7_1_ = (bool)(ppVar7->second & 1);
    }
    else {
      elements_used._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_80);
      def = cached_result;
      aStack_a8.elements_used =
           (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_80;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(spvtools::opt::Instruction*)::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_a0,&stack0xffffffffffffff58);
      bVar1 = analysis::DefUseManager::WhileEachUser
                        (this_00,(Instruction *)
                                 def.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>
                                 ._M_cur,&local_a0);
      elements_used._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = (bVar1 ^ 0xffU) & 1;
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_a0);
      const_mgr._7_1_ = 0;
      if ((elements_used._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        if (this->replacement_threshold_ < 1.0) {
          pIVar6 = Pass::context(&this->super_Pass);
          type_mgr = (TypeManager *)IRContext::get_constant_mgr(pIVar6);
          pIVar6 = Pass::context(&this->super_Pass);
          pTVar8 = IRContext::get_type_mgr(pIVar6);
          load_type = (Type *)pTVar8;
          uVar2 = opt::Instruction::type_id
                            ((Instruction *)
                             cached_result.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                             _M_cur);
          pTStack_c8 = analysis::TypeManager::GetType(pTVar8,uVar2);
          size_const._4_4_ = 1;
          KVar4 = analysis::Type::kind(pTStack_c8);
          pTVar8 = type_mgr;
          if (KVar4 == kArray) {
            iVar5 = (*pTStack_c8->_vptr_Type[0x17])();
            uVar2 = analysis::Array::LengthId((Array *)CONCAT44(extraout_var,iVar5));
            percent_used = (double)analysis::ConstantManager::FindDeclaredConstant
                                             ((ConstantManager *)pTVar8,uVar2);
            if ((Constant *)percent_used == (Constant *)0x0) {
              size_const._4_4_ = 0xffffffff;
            }
            else {
              iVar5 = (*((Constant *)percent_used)->_vptr_Constant[0xe])();
              if (CONCAT44(extraout_var_00,iVar5) == 0) {
                __assert_fail("size_const->AsIntConstant()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                              ,0xa3,
                              "bool spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(Instruction *)"
                             );
              }
              size_const._4_4_ = analysis::Constant::GetU32((Constant *)percent_used);
            }
          }
          else if (KVar4 == kStruct) {
            iVar5 = (*pTStack_c8->_vptr_Type[0x1d])();
            this_01 = analysis::Struct::element_types((Struct *)CONCAT44(extraout_var_01,iVar5));
            sVar9 = std::
                    vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                    ::size(this_01);
            size_const._4_4_ = (uint32_t)sVar9;
          }
          sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_80);
          auVar12._8_4_ = (int)(sVar10 >> 0x20);
          auVar12._0_8_ = sVar10;
          auVar12._12_4_ = 0x45300000;
          local_e0 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) /
                     (double)size_const._4_4_;
          const_mgr._7_1_ = local_e0 < this->replacement_threshold_;
        }
        else {
          const_mgr._7_1_ = true;
        }
      }
      else {
        const_mgr._7_1_ = false;
      }
      bVar1 = (bool)const_mgr._7_1_;
      local_e4 = opt::Instruction::result_id
                           ((Instruction *)
                            cached_result.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                            _M_cur);
      pmVar11 = std::
                unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                ::operator[](&this->should_replace_cache_,&local_e4);
      *pmVar11 = bVar1;
      this_local._7_1_ = (bool)(const_mgr._7_1_ & 1);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_80);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ReduceLoadSize::ShouldReplaceExtract(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* op_inst = def_use_mgr->GetDef(
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx));

  if (op_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  auto cached_result = should_replace_cache_.find(op_inst->result_id());
  if (cached_result != should_replace_cache_.end()) {
    return cached_result->second;
  }

  bool all_elements_used = false;
  std::set<uint32_t> elements_used;

  all_elements_used =
      !def_use_mgr->WhileEachUser(op_inst, [&elements_used](Instruction* use) {
        if (use->IsCommonDebugInstr()) return true;
        if (use->opcode() != spv::Op::OpCompositeExtract ||
            use->NumInOperands() == 1) {
          return false;
        }
        elements_used.insert(use->GetSingleWordInOperand(1));
        return true;
      });

  bool should_replace = false;
  if (all_elements_used) {
    should_replace = false;
  } else if (1.0 <= replacement_threshold_) {
    should_replace = true;
  } else {
    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Type* load_type = type_mgr->GetType(op_inst->type_id());
    uint32_t total_size = 1;
    switch (load_type->kind()) {
      case analysis::Type::kArray: {
        const analysis::Constant* size_const =
            const_mgr->FindDeclaredConstant(load_type->AsArray()->LengthId());

        if (size_const) {
          assert(size_const->AsIntConstant());
          total_size = size_const->GetU32();
        } else {
          // The size is spec constant, so it is unknown at this time.  Assume
          // it is very large.
          total_size = UINT32_MAX;
        }
      } break;
      case analysis::Type::kStruct:
        total_size = static_cast<uint32_t>(
            load_type->AsStruct()->element_types().size());
        break;
      default:
        break;
    }
    double percent_used = static_cast<double>(elements_used.size()) /
                          static_cast<double>(total_size);
    should_replace = (percent_used < replacement_threshold_);
  }

  should_replace_cache_[op_inst->result_id()] = should_replace;
  return should_replace;
}